

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O1

void celero::DoNotOptimizeAway<unsigned_long>(unsigned_long *x)

{
  unsigned_long *p;
  
  if (DoNotOptimizeAway<unsigned_long>(unsigned_long&&)::ttid == '\0') {
    DoNotOptimizeAway<unsigned_long>();
  }
  if (DoNotOptimizeAway<unsigned_long>::ttid._M_thread != 0) {
    return;
  }
  putchar((int)(char)*x);
  abort();
}

Assistant:

void DoNotOptimizeAway(T&& x)
	{
		static auto ttid = std::this_thread::get_id();
		if(ttid == std::thread::id())
		{
			// This forces the value to never be optimized away
			// by taking a reference then using it.
			const auto* p = &x;
			putchar(*reinterpret_cast<const char*>(p));

			// If we do get here, kick out because something has gone wrong.
			std::abort();
		}
	}